

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::dispatch::detail::Function_Caller_Ret<chaiscript::Boxed_Value,_false>::call
          (Function_Caller_Ret<chaiscript::Boxed_Value,_false> *this,
          vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
          *t_funcs,vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *params
          ,Type_Conversions_State *t_conversions)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Boxed_Value BVar2;
  Type_Conversions_State state;
  Type_Conversions conv;
  Boxed_Value BStack_e8;
  Type_Conversions_State local_d8;
  undefined1 local_c8 [40];
  _Rb_tree_impl<std::less<std::shared_ptr<chaiscript::detail::Type_Conversion_Base>_>,_true>
  _Stack_a0;
  _Rb_tree_impl<chaiscript::Type_Conversions::Less_Than,_true> _Stack_70;
  atomic_size_t aStack_40;
  Thread_Storage<std::set<const_std::type_info_*,_chaiscript::Type_Conversions::Less_Than,_std::allocator<const_std::type_info_*>_>_>
  local_38;
  Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves> local_30;
  
  if (t_conversions == (Type_Conversions_State *)0x0) {
    _Stack_a0.super__Rb_tree_header._M_header._M_left = &_Stack_a0.super__Rb_tree_header._M_header;
    _Stack_a0.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_a0.super__Rb_tree_header._M_header._4_4_ = 0;
    _Stack_a0.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c8._32_8_ = (__pthread_internal_list *)0x0;
    _Stack_a0._0_8_ = 0;
    local_c8._16_8_ = 0;
    local_c8._24_8_ = (__pthread_internal_list *)0x0;
    local_c8._0_8_ = 0;
    local_c8._8_8_ = 0;
    _Stack_70.super__Rb_tree_header._M_header._M_left = &_Stack_70.super__Rb_tree_header._M_header;
    _Stack_a0.super__Rb_tree_header._M_node_count = 0;
    _Stack_70._0_8_ = 0;
    _Stack_70.super__Rb_tree_header._M_header._M_color = _S_red;
    _Stack_70.super__Rb_tree_header._M_header._4_4_ = 0;
    _Stack_70.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    _Stack_70.super__Rb_tree_header._M_node_count = 0;
    aStack_40.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
    _Stack_a0.super__Rb_tree_header._M_header._M_right =
         _Stack_a0.super__Rb_tree_header._M_header._M_left;
    _Stack_70.super__Rb_tree_header._M_header._M_right =
         _Stack_70.super__Rb_tree_header._M_header._M_left;
    local_38.m_key = (Type_Conversions *)local_c8;
    local_30.m_key = (Type_Conversions *)local_c8;
    local_d8.m_saves._M_data =
         chaiscript::detail::threading::
         Thread_Storage<chaiscript::Type_Conversions::Conversion_Saves>::operator*(&local_30);
    local_d8.m_conversions._M_data = (Type_Conversions *)local_c8;
    dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>
              ((dispatch *)&BStack_e8,t_funcs,params,&local_d8);
    boxed_cast<chaiscript::Boxed_Value>((chaiscript *)this,&BStack_e8,(Type_Conversions_State *)0x0)
    ;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&BStack_e8.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    Type_Conversions::~Type_Conversions((Type_Conversions *)local_c8);
    _Var1._M_pi = extraout_RDX_00;
  }
  else {
    dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>
              ((dispatch *)local_c8,t_funcs,params,t_conversions);
    boxed_cast<chaiscript::Boxed_Value>((chaiscript *)this,(Boxed_Value *)local_c8,t_conversions);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
    _Var1._M_pi = extraout_RDX;
  }
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var1._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static Ret call(const std::vector<Const_Proxy_Function> &t_funcs, 
              const std::vector<Boxed_Value> &params, const Type_Conversions_State *t_conversions)
          {
            if (t_conversions) {
              return boxed_cast<Ret>(dispatch::dispatch(t_funcs, params, *t_conversions), t_conversions);
            } else {
              Type_Conversions conv;
              Type_Conversions_State state(conv, conv.conversion_saves());
              return boxed_cast<Ret>(dispatch::dispatch(t_funcs, params, state), t_conversions);
            }
          }